

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

int __thiscall QCss::Selector::specificity(Selector *this)

{
  int iVar1;
  long lVar2;
  qsizetype *pqVar3;
  
  lVar2 = (this->basicSelectors).d.size;
  if (lVar2 != 0) {
    pqVar3 = &(((this->basicSelectors).d.ptr)->attributeSelectors).d.size;
    iVar1 = 0;
    do {
      iVar1 = *(int *)(pqVar3 + -6) * 0x100 + ((int)*pqVar3 + *(int *)(pqVar3 + -3)) * 0x10 +
              ((iVar1 + 1) - (uint)(pqVar3[-9] == 0));
      pqVar3 = pqVar3 + 0xd;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    return iVar1;
  }
  return 0;
}

Assistant:

int Selector::specificity() const
{
    int val = 0;
    for (int i = 0; i < basicSelectors.size(); ++i) {
        const BasicSelector &sel = basicSelectors.at(i);
        if (!sel.elementName.isEmpty())
            val += 1;

        val += (sel.pseudos.size() + sel.attributeSelectors.size()) * 0x10;
        val += sel.ids.size() * 0x100;
    }
    return val;
}